

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  __type _Var3;
  bool bVar4;
  ostream *poVar5;
  int iVar6;
  char *pcVar7;
  locale l1;
  size_type local_270;
  locale l2;
  generator gen;
  allocator local_229;
  string name;
  localization_backend_manager mgr;
  locale l2_4;
  locale l1_4;
  locale local_1e8 [8];
  localization_backend_manager local_1e0 [8];
  string local_1d8;
  string real_name;
  string local_40;
  
  booster::locale::localization_backend_manager::global();
  std::__cxx11::string::string((string *)&real_name,"std",(allocator *)&name);
  booster::locale::localization_backend_manager::select((string *)&mgr,(uint)&real_name);
  std::__cxx11::string::~string((string *)&real_name);
  booster::locale::localization_backend_manager::global(local_1e0);
  booster::locale::localization_backend_manager::~localization_backend_manager(local_1e0);
  booster::locale::generator::generator(&gen);
  poVar5 = std::operator<<((ostream *)&std::cout,"en_US.UTF locale");
  std::endl<char,std::char_traits<char>>(poVar5);
  paVar1 = &real_name.field_2;
  real_name._M_string_length = 0;
  real_name.field_2._M_local_buf[0] = '\0';
  real_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&l1,"en_US.UTF-8",(allocator *)&l2);
  get_std_name(&name,(string *)&l1,&real_name);
  std::__cxx11::string::~string((string *)&l1);
  if (name._M_string_length == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"en_US.UTF-8 not supported");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    booster::locale::generator::generate((string *)&l1);
    std::locale::locale(&l2,real_name._M_dataplus._M_p);
    poVar5 = std::operator<<((ostream *)&std::cout,"UTF-8");
    std::endl<char,std::char_traits<char>>(poVar5);
    _Var3 = std::operator==(&name,&real_name);
    if (_Var3) {
      test_by_char<char,char>(&l1,&l2);
    }
    else {
      test_by_char<char,wchar_t>(&l1,&l2);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Wide UTF-");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    test_by_char<wchar_t,wchar_t>(&l1,&l2);
    std::locale::~locale(&l2);
    std::locale::~locale(&l1);
  }
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&real_name);
  poVar5 = std::operator<<((ostream *)&std::cout,"en_US.Latin-1 locale");
  std::endl<char,std::char_traits<char>>(poVar5);
  real_name._M_string_length = 0;
  real_name.field_2._M_local_buf[0] = '\0';
  real_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&l1,"en_US.ISO8859-1",(allocator *)&l2);
  get_std_name(&name,(string *)&l1,&real_name);
  std::__cxx11::string::~string((string *)&l1);
  if (name._M_string_length == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"en_US.ISO8859-8 not supported");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    booster::locale::generator::generate((string *)&l1);
    std::locale::locale(&l2,real_name._M_dataplus._M_p);
    test_by_char<char,char>(&l1,&l2);
    poVar5 = std::operator<<((ostream *)&std::cout,"Wide UTF-");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    test_by_char<wchar_t,wchar_t>(&l1,&l2);
    std::locale::~locale(&l2);
    std::locale::~locale(&l1);
  }
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&real_name);
  poVar5 = std::operator<<((ostream *)&std::cout,"he_IL.UTF locale");
  std::endl<char,std::char_traits<char>>(poVar5);
  real_name._M_string_length = 0;
  real_name.field_2._M_local_buf[0] = '\0';
  real_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&l1,"he_IL.UTF-8",(allocator *)&l2);
  get_std_name(&name,(string *)&l1,&real_name);
  std::__cxx11::string::~string((string *)&l1);
  if (name._M_string_length == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"he_IL.UTF-8 not supported");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    booster::locale::generator::generate((string *)&l1);
    std::locale::locale(&l2,real_name._M_dataplus._M_p);
    poVar5 = std::operator<<((ostream *)&std::cout,"UTF-8");
    std::endl<char,std::char_traits<char>>(poVar5);
    _Var3 = std::operator==(&name,&real_name);
    if (_Var3) {
      test_by_char<char,char>(&l1,&l2);
    }
    else {
      test_by_char<char,wchar_t>(&l1,&l2);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Wide UTF-");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    test_by_char<wchar_t,wchar_t>(&l1,&l2);
    std::locale::~locale(&l2);
    std::locale::~locale(&l1);
  }
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&real_name);
  poVar5 = std::operator<<((ostream *)&std::cout,"he_IL.ISO8859-8 locale");
  std::endl<char,std::char_traits<char>>(poVar5);
  real_name._M_string_length = 0;
  real_name.field_2._M_local_buf[0] = '\0';
  real_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&l1,"he_IL.ISO8859-8",(allocator *)&l2);
  get_std_name(&name,(string *)&l1,&real_name);
  std::__cxx11::string::~string((string *)&l1);
  if (name._M_string_length == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"he_IL.ISO8859-8 not supported");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    booster::locale::generator::generate((string *)&l1);
    std::locale::locale(&l2,real_name._M_dataplus._M_p);
    test_by_char<char,char>(&l1,&l2);
    poVar5 = std::operator<<((ostream *)&std::cout,"Wide UTF-");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    test_by_char<wchar_t,wchar_t>(&l1,&l2);
    std::locale::~locale(&l2);
    std::locale::~locale(&l1);
  }
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&real_name);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing UTF-8 punct workaround");
  std::endl<char,std::char_traits<char>>(poVar5);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&real_name,"ru_RU.UTF-8",(allocator *)&l2);
  get_std_name((string *)&l1,&real_name,&name);
  std::__cxx11::string::~string((string *)&real_name);
  if (local_270 == 0) {
    pcVar7 = "- No russian locale";
  }
  else {
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l1
                            ,&name);
    if (!bVar4) {
      booster::locale::generator::generate((string *)&l1_4);
      std::locale::locale(&l2_4,name._M_dataplus._M_p);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&real_name);
      std::ios::imbue(local_1e8);
      std::locale::~locale(local_1e8);
      std::ostream::_M_insert<double>(12345.45);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string((string *)&local_1d8,"windows-1251",&local_229);
      booster::locale::conv::from_utf<char>
                (&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l2,
                 &local_1d8,stop);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&l2);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&real_name);
      poVar5 = std::operator<<((ostream *)&std::cout,"- No invalid UTF. No need to check");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::locale::~locale(&l2_4);
      std::locale::~locale(&l1_4);
      goto LAB_00105e73;
    }
    pcVar7 = "- Not having UTF-8 locale, no need for workaround";
  }
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_00105e73:
  std::__cxx11::string::~string((string *)&l1);
  std::__cxx11::string::~string((string *)&name);
  booster::locale::generator::~generator(&gen);
  booster::locale::localization_backend_manager::~localization_backend_manager(&mgr);
  iVar6 = test_counter - error_counter;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar5 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar6);
  poVar5 = std::operator<<(poVar5," tests");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (0 < error_counter) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,error_counter);
    poVar5 = std::operator<<(poVar5," tests");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  poVar5 = std::operator<<((ostream *)&std::cout," ");
  lVar2 = *(long *)poVar5;
  *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 8) = 1;
  *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  poVar5 = std::ostream::_M_insert<double>(((double)iVar6 * 100.0) / (double)test_counter);
  poVar5 = std::operator<<(poVar5,"% of tests completed sucsessefully");
  std::endl<char,std::char_traits<char>>(poVar5);
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        booster::locale::localization_backend_manager mgr = booster::locale::localization_backend_manager::global();
        mgr.select("std");
        booster::locale::localization_backend_manager::global(mgr);
        booster::locale::generator gen;

        {
            std::cout << "en_US.UTF locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("en_US.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "en_US.UTF-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                std::cout << "UTF-8" << std::endl;
                if(name==real_name) 
                    test_by_char<char,char>(l1,l2);
                else
                    test_by_char<char,wchar_t>(l1,l2);
                
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "en_US.Latin-1 locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("en_US.ISO8859-1",&real_name);
            if(name.empty()) {
                std::cout << "en_US.ISO8859-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                test_by_char<char,char>(l1,l2);
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "he_IL.UTF locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("he_IL.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "he_IL.UTF-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                std::cout << "UTF-8" << std::endl;
                if(name==real_name) 
                    test_by_char<char,char>(l1,l2);
                else
                    test_by_char<char,wchar_t>(l1,l2);
                
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "he_IL.ISO8859-8 locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("he_IL.ISO8859-8",&real_name);
            if(name.empty()) {
                std::cout << "he_IL.ISO8859-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                test_by_char<char,char>(l1,l2);
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "Testing UTF-8 punct workaround" << std::endl;
            std::string real_name;
            std::string name = get_std_name("ru_RU.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "- No russian locale" << std::endl;
            }
            else if(name != real_name) {
                std::cout << "- Not having UTF-8 locale, no need for workaround" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                bool fails = false;
                try {
                    std::ostringstream ss;
                    ss.imbue(l2);
                    ss << 12345.45;
                    booster::locale::conv::from_utf<char>(ss.str(),"windows-1251",booster::locale::conv::stop);
                    fails = false;
                }
                catch(...) {
                    fails = true;
                }
                
                if(!fails) {
                    std::cout << "- No invalid UTF. No need to check"<<std::endl;
                }
                else {
                    std::ostringstream ss;
                    ss.imbue(l1);
                    ss << std::setprecision(10) ;
                    ss << booster::locale::as::number << 12345.45;
                    TEST(ss.str() == "12 345,45" || ss.str()=="12345,45");
                }
            }
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();

}